

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyOrthonormal<float>(Matrix33<float> *A)

{
  uint __line;
  long lVar1;
  long lVar2;
  float (*pafVar3) [3];
  char *__assertion;
  Matrix33<float> prod;
  Matrix33<float> local_3c;
  
  Imath_3_2::Matrix33<float>::transposed(A);
  pafVar3 = (float (*) [3])&prod;
  Imath_3_2::Matrix33<float>::operator*(A,&local_3c);
  lVar1 = 0;
  do {
    if (lVar1 == 3) {
      return;
    }
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        if (1.1920929e-05 <= ABS(*(float *)((long)prod.x + lVar1 * 0x10) + -1.0)) {
          __assertion = "std::abs (prod[i][j] - 1) < valueEps";
          __line = 0x1d;
LAB_001484db:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,__line,"void verifyOrthonormal(const Imath_3_2::Matrix33<T> &) [T = float]"
                       );
        }
      }
      else if (1.1920929e-05 <= ABS((*(float (*) [3])*pafVar3)[lVar2])) {
        __assertion = "std::abs (prod[i][j]) < valueEps";
        __line = 0x1f;
        goto LAB_001484db;
      }
    }
    lVar1 = lVar1 + 1;
    pafVar3 = pafVar3 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T (100) * std::numeric_limits<T>::epsilon ();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed ();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}